

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::grow
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this,size_t size)

{
  size_t __t;
  wchar_t *pwVar1;
  pointer p;
  size_t sVar2;
  wchar_t *__result;
  wchar_t *local_68;
  wchar_t *new_data;
  wchar_t *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_t size_local;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this_local;
  
  local_68 = (wchar_t *)std::allocator_traits<std::allocator<wchar_t>_>::max_size(&this->alloc_);
  __t = detail::buffer<wchar_t>::capacity(&this->super_buffer<wchar_t>);
  pwVar1 = (wchar_t *)(__t + (__t >> 1));
  old_data = (wchar_t *)size;
  if ((size <= pwVar1) && (old_data = pwVar1, local_68 < pwVar1)) {
    if (local_68 < size) {
      local_68 = (wchar_t *)size;
    }
    old_data = local_68;
  }
  pwVar1 = detail::buffer<wchar_t>::data(&this->super_buffer<wchar_t>);
  p = std::allocator_traits<std::allocator<wchar_t>_>::allocate(&this->alloc_,(size_type)old_data);
  sVar2 = detail::buffer<wchar_t>::size(&this->super_buffer<wchar_t>);
  __result = detail::make_checked<wchar_t>(p,(size_t)old_data);
  std::uninitialized_copy<wchar_t*,wchar_t*>(pwVar1,pwVar1 + sVar2,__result);
  detail::buffer<wchar_t>::set(&this->super_buffer<wchar_t>,p,(size_t)old_data);
  if (pwVar1 != this->store_) {
    __gnu_cxx::new_allocator<wchar_t>::deallocate
              ((new_allocator<wchar_t> *)&this->alloc_,pwVar1,__t);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}